

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O1

void __thiscall QOpenGLTexture::setMipLevelRange(QOpenGLTexture *this,int baseLevel,int maxLevel)

{
  QOpenGLTexturePrivate *this_00;
  QOpenGLTextureHelper *pQVar1;
  code *UNRECOVERED_JUMPTABLE;
  long *plVar2;
  
  this_00 = (this->d_ptr).d;
  QOpenGLTexturePrivate::create(this_00);
  if (((this_00->features).super_QFlagsStorageHelper<QOpenGLTexture::Feature,_4>.
       super_QFlagsStorage<QOpenGLTexture::Feature>.i & 0x8000) != 0) {
    pQVar1 = this_00->texFuncs;
    UNRECOVERED_JUMPTABLE = (code *)pQVar1->TextureParameteri;
    plVar2 = (long *)((long)&pQVar1->functions + *(long *)&pQVar1->field_0x10);
    if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
      UNRECOVERED_JUMPTABLE = *(code **)(UNRECOVERED_JUMPTABLE + *plVar2 + -1);
    }
    (*UNRECOVERED_JUMPTABLE)
              (plVar2,this_00->textureId,this_00->target,this_00->bindingTarget,0x813c,baseLevel);
    pQVar1 = this_00->texFuncs;
    UNRECOVERED_JUMPTABLE = (code *)pQVar1->TextureParameteri;
    plVar2 = (long *)((long)&pQVar1->functions + *(long *)&pQVar1->field_0x10);
    if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
      UNRECOVERED_JUMPTABLE = *(code **)(UNRECOVERED_JUMPTABLE + *plVar2 + -1);
    }
    (*UNRECOVERED_JUMPTABLE)
              (plVar2,this_00->textureId,this_00->target,this_00->bindingTarget,0x813d,maxLevel);
    return;
  }
  setMipLevelRange();
  return;
}

Assistant:

void QOpenGLTexture::setMipLevelRange(int baseLevel, int maxLevel)
{
    Q_D(QOpenGLTexture);
    d->create();
    if (!d->features.testFlag(TextureMipMapLevel)) {
        qWarning("QOpenGLTexture::setMipLevelRange: requires OpenGL >= 1.2 or OpenGL ES >= 3.0");
        return;
    }
    Q_ASSERT(d->textureId);
    Q_ASSERT(d->texFuncs);
    Q_ASSERT(baseLevel <= maxLevel);
    d->texFuncs->glTextureParameteri(d->textureId, d->target, d->bindingTarget, GL_TEXTURE_BASE_LEVEL, baseLevel);
    d->texFuncs->glTextureParameteri(d->textureId, d->target, d->bindingTarget, GL_TEXTURE_MAX_LEVEL, maxLevel);
}